

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

uint32_t helper_fadd_tricore(CPUTriCoreState *env,uint32_t r1,uint32_t r2)

{
  byte bVar1;
  float32 fVar2;
  byte flags;
  float32 fVar3;
  
  fVar2 = float32_add_tricore(r2,r1,&env->fp_status);
  bVar1 = (env->fp_status).float_exception_flags;
  flags = bVar1 & 0xbd;
  if (flags == 0) {
    env->PSW_USB_C = 0;
  }
  else {
    fVar3 = 0x7fc00001;
    if (0x7f800000 < (r2 & 0x7fffffff)) {
      fVar3 = fVar2;
    }
    if ((bVar1 & 1) == 0) {
      fVar3 = fVar2;
    }
    if (0x7f800000 < (r1 & 0x7fffffff)) {
      fVar3 = fVar2;
    }
    f_update_psw_flags(env,flags);
    fVar2 = fVar3;
  }
  return fVar2;
}

Assistant:

FADD_SUB(add)
FADD_SUB(sub)

uint32_t helper_fmul(CPUTriCoreState *env, uint32_t r1, uint32_t r2)
{
    uint32_t flags;
    float32 arg1 = make_float32(r1);
    float32 arg2 = make_float32(r2);
    float32 f_result;

    f_result = float32_mul(arg1, arg2, &env->fp_status);

    flags = f_get_excp_flags(env);
    if (flags) {
        /* If the output is a NaN, but the inputs aren't,
           we return a unique value.  */
        if ((flags & float_flag_invalid)
            && !float32_is_any_nan(arg1)
            && !float32_is_any_nan(arg2)) {
                f_result = MUL_NAN;
        }
        f_update_psw_flags(env, flags);
    } else {
        env->FPU_FS = 0;
    }
    return (uint32_t)f_result;

}